

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
KillBotsIRCCommand::trigger
          (KillBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  char *pcVar2;
  const_iterator __begin1;
  undefined8 *puVar3;
  undefined8 *local_48;
  undefined8 *local_40;
  
  pcVar2 = channel._M_str;
  lVar1 = Jupiter::IRC::Client::getChannel
                    (source,channel._M_len,pcVar2,pcVar2,nick._M_len,nick._M_str);
  if (lVar1 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)&local_48);
    puVar3 = local_48;
    if (local_48 == local_40) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,pcVar2,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    else {
      for (; puVar3 != local_40; puVar3 = puVar3 + 1) {
        RenX::Server::send(*puVar3,8,"killbots");
        RenX::Server::sendMessage(*puVar3,0x2b,"All bots have been removed from the server.");
      }
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_48);
  }
  return;
}

Assistant:

void KillBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	for (const auto& server : servers) {
		server->send("killbots"sv);
		server->sendMessage("All bots have been removed from the server."sv);
	}
}